

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialStatistics.cpp
# Opt level: O0

void __thiscall OpenMD::SpatialStatistics::processFrame(SpatialStatistics *this,int param_2)

{
  bool bVar1;
  uint uVar2;
  StuntDouble *in_RDI;
  int bin;
  Vector3d pos;
  int i;
  StuntDouble *sd;
  int *in_stack_ffffffffffffff68;
  Vector3<double> *in_stack_ffffffffffffff70;
  SelectionManager *in_stack_ffffffffffffff80;
  SelectionEvaluator *in_stack_ffffffffffffffa8;
  Vector3<double> local_38;
  StuntDouble *local_18;
  
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)&in_RDI[2].objType_);
  if (bVar1) {
    in_stack_ffffffffffffff68 = &in_RDI[0xd].localIndex_;
    in_stack_ffffffffffffff70 = &local_38;
    SelectionEvaluator::evaluate(in_stack_ffffffffffffffa8);
    SelectionManager::setSelectionSet(in_stack_ffffffffffffff80,(SelectionSet *)in_RDI);
    SelectionSet::~SelectionSet((SelectionSet *)0x1b9ce7);
  }
  local_18 = SelectionManager::beginSelected(in_stack_ffffffffffffff80,(int *)in_RDI);
  while (local_18 != (StuntDouble *)0x0) {
    StuntDouble::getPos(in_RDI);
    Vector3<double>::Vector3(in_stack_ffffffffffffff70,(Vector3<double> *)in_stack_ffffffffffffff68)
    ;
    uVar2 = (*in_RDI->_vptr_StuntDouble[5])(in_RDI,&stack0xffffffffffffff80);
    (*in_RDI->_vptr_StuntDouble[6])(in_RDI,local_18,(ulong)uVar2);
    local_18 = SelectionManager::nextSelected(in_stack_ffffffffffffff80,(int *)in_RDI);
  }
  return;
}

Assistant:

void SpatialStatistics::processFrame(int) {
    StuntDouble* sd;
    int i;

    if (evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    // loop over the selected atoms:
    for (sd = seleMan_.beginSelected(i); sd != NULL;
         sd = seleMan_.nextSelected(i)) {
      // figure out where that object is:
      Vector3d pos = sd->getPos();

      int bin = getBin(pos);

      // forward the work of statistics on to the subclass:
      processStuntDouble(sd, bin);
    }
  }